

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcPartialsPartials
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,double *partials1,double *matrices1,
          double *partials2,double *matrices2,int startPattern,int endPattern)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double *pdVar10;
  int iVar11;
  double *pdVar12;
  long lVar13;
  int j;
  long lVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  double *pdVar18;
  int iVar19;
  double *pdVar20;
  double *pdVar21;
  double *pdVar22;
  double *pdVar23;
  double *pdVar24;
  double *pdVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double *local_b0;
  double *local_a8;
  double *local_a0;
  double *local_98;
  long local_90;
  
  uVar3 = this->kStateCount;
  iVar19 = uVar3 + 1;
  uVar4 = this->kCategoryCount;
  iVar5 = this->kPartialsPaddedStateCount;
  lVar13 = (long)iVar5;
  iVar6 = this->kPatternCount;
  iVar7 = this->kMatrixSize;
  local_b0 = matrices1 + 3;
  local_a8 = matrices2 + 3;
  iVar11 = iVar5 * startPattern;
  local_a0 = matrices1;
  local_98 = matrices2;
  for (uVar17 = 0; uVar17 != (~((int)uVar4 >> 0x1f) & uVar4); uVar17 = uVar17 + 1) {
    local_90 = 0;
    pdVar21 = destP + (iVar6 * (int)uVar17 + startPattern) * iVar5;
    pdVar12 = partials1 + iVar11;
    pdVar20 = partials2 + iVar11;
    for (iVar15 = startPattern; iVar15 < endPattern; iVar15 = iVar15 + 1) {
      pdVar18 = local_98;
      pdVar23 = local_b0;
      pdVar24 = local_a0;
      pdVar25 = local_a8;
      for (uVar16 = 0; uVar16 != (~((int)uVar3 >> 0x1f) & uVar3); uVar16 = uVar16 + 1) {
        auVar27 = ZEXT816(0) << 0x40;
        lVar14 = 0;
        pdVar10 = pdVar24;
        pdVar22 = pdVar18;
        lVar26 = local_90;
        while (lVar14 < (int)uVar3 / 4 << 2) {
          lVar26 = lVar26 + 0x20;
          pdVar22 = pdVar22 + 4;
          pdVar10 = pdVar10 + 4;
          auVar29._16_16_ = *(undefined1 (*) [16])(pdVar25 + lVar14 + -3);
          auVar29._0_16_ = *(undefined1 (*) [16])(pdVar23 + lVar14 + -3);
          auVar31._16_16_ = *(undefined1 (*) [16])(pdVar20 + lVar14);
          auVar31._0_16_ = *(undefined1 (*) [16])(pdVar12 + lVar14);
          auVar27 = vfmadd213pd_fma(auVar31,auVar29,ZEXT1632(auVar27));
          auVar30._16_16_ = *(undefined1 (*) [16])(pdVar25 + lVar14 + -1);
          auVar30._0_16_ = *(undefined1 (*) [16])(pdVar23 + lVar14 + -1);
          auVar28._16_16_ = *(undefined1 (*) [16])(pdVar20 + lVar14 + 2);
          auVar28._0_16_ = *(undefined1 (*) [16])(pdVar12 + lVar14 + 2);
          lVar14 = lVar14 + 4;
          auVar27 = vfmadd213pd_fma(auVar28,auVar30,ZEXT1632(auVar27));
        }
        auVar9 = (undefined1  [16])0x0;
        auVar8 = auVar27;
        while (lVar14 < (int)uVar3) {
          auVar32._8_8_ = 0;
          auVar32._0_8_ = *pdVar10;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = *pdVar22;
          lVar14 = lVar14 + 1;
          pdVar22 = pdVar22 + 1;
          pdVar10 = pdVar10 + 1;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *(ulong *)((long)(partials1 + iVar11) + lVar26);
          auVar8 = vfmadd231sd_fma(auVar8,auVar32,auVar1);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)((long)(partials2 + iVar11) + lVar26);
          auVar9 = vfmadd231sd_fma(auVar9,auVar33,auVar2);
          lVar26 = lVar26 + 8;
        }
        auVar27 = vshufpd_avx(auVar27,auVar27,1);
        auVar1 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,1);
        pdVar25 = pdVar25 + iVar19;
        pdVar23 = pdVar23 + iVar19;
        pdVar18 = pdVar18 + iVar19;
        pdVar24 = pdVar24 + iVar19;
        *pdVar21 = (auVar27._0_8_ + auVar8._0_8_) * (auVar1._0_8_ + auVar9._0_8_);
        pdVar21 = pdVar21 + 1;
      }
      local_90 = local_90 + lVar13 * 8;
      pdVar20 = pdVar20 + lVar13;
      pdVar12 = pdVar12 + lVar13;
    }
    iVar11 = iVar11 + iVar6 * iVar5;
    local_a8 = local_a8 + iVar7;
    local_b0 = local_b0 + iVar7;
    local_98 = local_98 + iVar7;
    local_a0 = local_a0 + iVar7;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartials(REALTYPE* destP,
                                                             const REALTYPE* partials1,
                                                             const REALTYPE* matrices1,
                                                             const REALTYPE* partials2,
                                                             const REALTYPE* matrices2,
                                                             int startPattern,
                                                             int endPattern) {
    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;

    int stateCountModFour = (kStateCount / 4) * 4;

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials1Ptr = &partials1[v];
        const REALTYPE* partials2Ptr = &partials2[v];
        REALTYPE* destPtr = &destP[v];
        for (int k = startPattern; k < endPattern; k++) {

            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices1Ptr = matrices1 + matrixOffset + i * matrixIncr;
                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
                REALTYPE sum1A = 0.0, sum2A = 0.0;
                REALTYPE sum1B = 0.0, sum2B = 0.0;
                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    sum1A += matrices1Ptr[j + 0] * partials1Ptr[j + 0];
                    sum2A += matrices2Ptr[j + 0] * partials2Ptr[j + 0];

                    sum1B += matrices1Ptr[j + 1] * partials1Ptr[j + 1];
                    sum2B += matrices2Ptr[j + 1] * partials2Ptr[j + 1];

                    sum1A += matrices1Ptr[j + 2] * partials1Ptr[j + 2];
                    sum2A += matrices2Ptr[j + 2] * partials2Ptr[j + 2];

                    sum1B += matrices1Ptr[j + 3] * partials1Ptr[j + 3];
                    sum2B += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
                }

                for (; j < kStateCount; j++) {
                    sum1A += matrices1Ptr[j] * partials1Ptr[j];
                    sum2A += matrices2Ptr[j] * partials2Ptr[j];
                }

                *(destPtr++) = (sum1A + sum1B) * (sum2A + sum2B);
            }
            destPtr += P_PAD;
            partials1Ptr += kPartialsPaddedStateCount;
            partials2Ptr += kPartialsPaddedStateCount;
        }
    }
}